

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O2

void decompTest(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int w,int h,int pf,
               char *basename,int subsamp,int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  tjscalingfactor sf;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  byte *__ptr;
  long lVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  char *pcVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  uint local_c4;
  uchar *local_c0;
  int _hdrh;
  int _hdrw;
  long local_98;
  ulong local_90;
  size_t local_88;
  byte *local_80;
  tjhandle local_78;
  uchar *local_70;
  int n;
  ulong local_60;
  char *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  n = 0;
  local_78 = handle;
  local_70 = jpegBuf;
  lVar11 = tjGetScalingFactors(&n);
  if (n == 0 || lVar11 == 0) {
    uVar13 = tjGetErrorStr();
    printf("TurboJPEG ERROR:\n%s\n",uVar13);
    exitStatus = -1;
    return;
  }
  lVar16 = (long)pf;
  local_60 = (ulong)basename & 0xffffffff;
  local_58 = "Bottom-Up";
  if ((subsamp & 2U) == 0) {
    local_58 = "Top-Down ";
  }
  local_48 = lVar16 - 7;
  local_38 = 0;
  local_40 = lVar11;
  iVar6 = n;
LAB_00104079:
  iVar7 = (int)basename;
  if (iVar6 <= local_38) {
    return;
  }
  if ((iVar7 == 0) || (iVar7 == 3)) {
LAB_001040d3:
    sf = *(tjscalingfactor *)(lVar11 + local_38 * 8);
    _hdrw = 0;
    _hdrh = 0;
    iVar24 = sf.num;
    iVar9 = sf.denom;
    uVar25 = (long)(iVar24 * w + iVar9 + -1) / (long)iVar9;
    uVar17 = (long)(iVar24 * h + iVar9 + -1) / (long)iVar9;
    uVar22 = uVar17 & 0xffffffff;
    uVar5 = (uint)uVar17;
    iVar6 = tjDecompressHeader2(local_78,local_70,jpegSize,&_hdrw,&_hdrh);
    if (iVar6 != -1) {
      if (((_hdrw != w) || (_hdrh != h)) || (iVar7 != -1)) {
        printf("ERROR: %s\n","Incorrect JPEG header");
LAB_001042cd:
        __ptr = (byte *)0x0;
        local_c0 = (uchar *)0x0;
LAB_001042d5:
        exitStatus = -1;
        goto LAB_001042da;
      }
      iVar6 = (int)uVar25;
      lVar11 = (long)tjPixelSize[lVar16];
      __ptr = (byte *)calloc(1,(int)(uVar5 * iVar6) * lVar11);
      if (__ptr == (byte *)0x0) {
        printf("ERROR: %s\n","Memory allocation failure");
        goto LAB_001042cd;
      }
      if (doYUV != 0) {
        local_88 = tjBufSizeYUV2(uVar25 & 0xffffffff,pad,uVar22,0xffffffff);
        lVar12 = tjInitDecompress();
        if (lVar12 == 0) goto LAB_001043b7;
        local_c0 = (uchar *)calloc(1,local_88);
        if (local_c0 == (uchar *)0x0) {
          pcVar20 = "ERROR: %s\n";
          pcVar21 = "Memory allocation failure";
          goto LAB_001043d6;
        }
        printf("JPEG -> YUV %s ",subNameLong[local_60]);
        if (iVar24 == 1 && iVar9 == 1) {
          printf("... ");
        }
        else {
          printf("%d/%d ... ",(ulong)sf & 0xffffffff,(ulong)sf >> 0x20);
        }
        iVar7 = tjDecompressToYUV2(local_78,local_70,jpegSize,local_c0,uVar25 & 0xffffffff,pad,
                                   uVar22);
        if (iVar7 != -1) {
          iVar7 = checkBufYUV(local_c0,iVar6,uVar5,-1,sf);
          pcVar21 = "Passed.";
          if (iVar7 == 0) {
            pcVar21 = "FAILED!";
          }
          puts(pcVar21);
          printf("YUV %s -> %s %s ... ",subNameLong[local_60],pixFormatStr[lVar16],local_58);
          iVar7 = tjDecodeYUV(lVar12,local_c0,pad,0xffffffff,__ptr,uVar25 & 0xffffffff,0,uVar22,
                              lVar16,subsamp);
          if (iVar7 != -1) {
            tjDestroy(lVar12);
            goto LAB_0010450c;
          }
        }
        uVar13 = tjGetErrorStr();
        printf("TurboJPEG ERROR:\n%s\n",uVar13);
        goto LAB_001042d5;
      }
      printf("JPEG -> %s %s ",pixFormatStr[lVar16],local_58);
      if (iVar24 == 1 && iVar9 == 1) {
        printf("... ");
      }
      else {
        printf("%d/%d ... ",(ulong)sf & 0xffffffff,(ulong)sf >> 0x20);
      }
      iVar7 = tjDecompress2(local_78,local_70,jpegSize,__ptr,uVar25 & 0xffffffff,0,uVar22,pf,subsamp
                           );
      if (iVar7 == -1) {
LAB_001043b7:
        pcVar21 = (char *)tjGetErrorStr();
        pcVar20 = "TurboJPEG ERROR:\n%s\n";
LAB_001043d6:
        printf(pcVar20,pcVar21);
        local_c0 = (uchar *)0x0;
        goto LAB_001042d5;
      }
      local_c0 = (uchar *)0x0;
LAB_0010450c:
      iVar8 = (iVar24 << 4) / iVar9;
      iVar9 = (iVar24 * 8) / iVar9;
      local_98 = CONCAT44(local_98._4_4_,iVar9);
      iVar7 = 0;
      iVar24 = 0;
      iVar15 = 0;
      if (pf != 6) {
        iVar7 = tjBlueOffset[lVar16];
        iVar24 = tjGreenOffset[lVar16];
        iVar15 = tjRedOffset[lVar16];
      }
      local_88 = (size_t)iVar15;
      local_50 = (long)iVar7;
      if (pf == 0xb) {
        uVar14 = 0;
        local_90 = 0;
        if (0 < iVar6) {
          local_90 = uVar25 & 0xffffffff;
        }
        local_c4 = 0;
        if (0 < (int)uVar5) {
          local_c4 = uVar5;
        }
        local_80 = __ptr + 3;
        for (; uVar14 != local_c4; uVar14 = uVar14 + 1) {
          uVar10 = ~uVar14 + uVar5;
          if ((subsamp & 2U) == 0) {
            uVar10 = uVar14;
          }
          pbVar19 = local_80 + (int)(uVar10 * iVar6) * lVar11;
          for (uVar25 = 0; local_90 != uVar25; uVar25 = uVar25 + 1) {
            bVar1 = pbVar19[-3];
            bVar2 = pbVar19[-2];
            bVar3 = pbVar19[-1];
            bVar4 = *pbVar19;
            if (((int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) /
                      (long)iVar9) + (int)uVar14 / iVar9 & 1U) == 0) {
              if (bVar1 < 0xfe) {
LAB_001048a9:
                pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
                pcVar20 = "c";
                uVar17 = (ulong)uVar14;
                uVar25 = uVar25 & 0xffffffff;
                uVar23 = (ulong)bVar1;
              }
              else if (bVar2 < 0xfe) {
LAB_001048da:
                pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_0010498b:
                pcVar20 = "m";
                uVar17 = (ulong)uVar14;
                uVar25 = uVar25 & 0xffffffff;
                uVar23 = (ulong)bVar2;
              }
              else {
                if (0xfd < bVar3) {
                  if ((int)uVar14 < iVar8) {
                    if (bVar4 < 0xfe) goto LAB_001048e6;
                  }
                  else if (1 < bVar4) {
                    pcVar21 = "\nComp. %s at %d,%d should be 0, not %d\n";
                    goto LAB_001049a3;
                  }
                  goto LAB_0010469a;
                }
                pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_0010490b:
                pcVar20 = "y";
                uVar17 = (ulong)uVar14;
                uVar25 = uVar25 & 0xffffffff;
                uVar23 = (ulong)bVar3;
              }
              goto LAB_001049b2;
            }
            if (bVar1 < 0xfe) goto LAB_001048a9;
            if (1 < bVar3) {
              pcVar21 = "\nComp. %s at %d,%d should be 0, not %d\n";
              goto LAB_0010490b;
            }
            if (bVar4 < 0xfe) goto LAB_001048e6;
            if ((int)uVar14 < iVar8) {
              if (1 < bVar2) {
                pcVar21 = "\nComp. %s at %d,%d should be 0, not %d\n";
                goto LAB_0010498b;
              }
            }
            else if (bVar2 < 0xfe) goto LAB_001048da;
LAB_0010469a:
            pbVar19 = pbVar19 + lVar11;
          }
        }
      }
      else {
        local_80 = (byte *)(long)tjAlphaOffset[lVar16];
        uVar17 = 0;
        local_90 = 0;
        if (0 < iVar6) {
          local_90 = uVar25 & 0xffffffff;
        }
        local_c4 = 0;
        if (0 < (int)uVar5) {
          local_c4 = uVar5;
        }
        while (uVar14 = (uint)uVar17, uVar14 != local_c4) {
          uVar10 = ~uVar14 + uVar5;
          if ((subsamp & 2U) == 0) {
            uVar10 = uVar14;
          }
          pbVar19 = __ptr + (int)(uVar10 * iVar6) * lVar11;
          uVar25 = 0;
          while (local_90 != uVar25) {
            uVar22 = 0xff;
            if (local_48 < 4) {
              uVar22 = (ulong)pbVar19[(long)local_80];
            }
            bVar1 = pbVar19[local_88];
            uVar23 = (ulong)bVar1;
            bVar2 = pbVar19[iVar24];
            bVar3 = pbVar19[local_50];
            if (((int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) /
                      (long)iVar9) + (int)uVar14 / iVar9 & 1U) == 0) {
              if (iVar8 <= (int)uVar14) {
                if (bVar1 < 2) goto LAB_001047fb;
                pcVar21 = "\nComp. %s at %d,%d should be 0, not %d\n";
LAB_0010495f:
                pcVar20 = "r";
                uVar25 = uVar25 & 0xffffffff;
                goto LAB_001049b2;
              }
              if (bVar1 < 0xfe) goto LAB_001048f2;
              if (bVar2 < 0xfe) goto LAB_00104928;
              if (bVar3 < 0xfe) {
                pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
                goto LAB_00104975;
              }
            }
            else {
              if ((int)uVar14 < iVar8) {
                if (bVar1 < 0xfe) goto LAB_001048f2;
LAB_001047fb:
                if (1 < bVar2) {
                  pcVar21 = "\nComp. %s at %d,%d should be 0, not %d\n";
                  goto LAB_00104938;
                }
              }
              else {
                if (bVar1 < 0xfe) {
LAB_001048f2:
                  pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
                  goto LAB_0010495f;
                }
                if (bVar2 < 0xfe) {
LAB_00104928:
                  pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00104938:
                  pcVar20 = "g";
                  uVar25 = uVar25 & 0xffffffff;
                  uVar23 = (ulong)bVar2;
                  goto LAB_001049b2;
                }
              }
              if (1 < bVar3) {
                pcVar21 = "\nComp. %s at %d,%d should be 0, not %d\n";
LAB_00104975:
                pcVar20 = "b";
                uVar25 = uVar25 & 0xffffffff;
                uVar23 = (ulong)bVar3;
                goto LAB_001049b2;
              }
            }
            uVar25 = uVar25 + 1;
            pbVar19 = pbVar19 + lVar11;
            if ((uint)uVar22 < 0xfe) {
              uVar25 = (ulong)((int)uVar25 - 1);
              pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
              pcVar20 = "a";
              uVar23 = uVar22;
              goto LAB_001049b2;
            }
          }
          uVar17 = (ulong)(uVar14 + 1);
        }
      }
      pcVar21 = "Passed.";
      goto LAB_00104a7e;
    }
    uVar13 = tjGetErrorStr();
    printf("TurboJPEG ERROR:\n%s\n",uVar13);
    exitStatus = -1;
    local_c0 = (uchar *)0x0;
    __ptr = (byte *)0x0;
    goto LAB_001042da;
  }
  if (iVar7 == 5) {
    if ((*(int *)(lVar11 + local_38 * 8) == 1) && (*(int *)(lVar11 + 4 + local_38 * 8) - 1U < 2))
    goto LAB_001040d3;
  }
  else if (((*(int *)(lVar11 + local_38 * 8) == 1) &&
           (uVar5 = *(uint *)(lVar11 + 4 + local_38 * 8), uVar5 < 5)) &&
          ((0x16U >> (uVar5 & 0x1f) & 1) != 0)) goto LAB_001040d3;
  goto LAB_001042fe;
LAB_001048e6:
  pcVar21 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_001049a3:
  pcVar20 = "k";
  uVar17 = (ulong)uVar14;
  uVar25 = uVar25 & 0xffffffff;
  uVar23 = (ulong)bVar4;
LAB_001049b2:
  printf(pcVar21,pcVar20,uVar17,uVar25,uVar23);
  exitStatus = -1;
  local_98 = iVar6 * lVar11;
  pbVar19 = __ptr;
  for (uVar25 = 0; pbVar18 = pbVar19, uVar17 = local_90, uVar25 != local_c4; uVar25 = uVar25 + 1) {
    while (uVar17 != 0) {
      if (pf == 0xb) {
        printf("%.3d/%.3d/%.3d/%.3d ",(ulong)*pbVar18,(ulong)pbVar18[1],(ulong)pbVar18[2],
               (ulong)pbVar18[3]);
      }
      else {
        printf("%.3d/%.3d/%.3d ",(ulong)pbVar18[local_88],(ulong)pbVar18[iVar24],
               (ulong)pbVar18[local_50]);
      }
      pbVar18 = pbVar18 + lVar11;
      uVar17 = uVar17 - 1;
    }
    putchar(10);
    pbVar19 = pbVar19 + local_98;
  }
  pcVar21 = "FAILED!";
LAB_00104a7e:
  printf(pcVar21);
  putchar(10);
LAB_001042da:
  free(local_c0);
  free(__ptr);
  lVar11 = local_40;
  iVar6 = n;
LAB_001042fe:
  local_38 = local_38 + 1;
  goto LAB_00104079;
}

Assistant:

static void decompTest(tjhandle handle, unsigned char *jpegBuf,
                       unsigned long jpegSize, int w, int h, int pf,
                       char *basename, int subsamp, int flags)
{
  int i, n = 0;
  tjscalingfactor *sf = tjGetScalingFactors(&n);

  if (!sf || !n) THROW_TJ();

  for (i = 0; i < n; i++) {
    if (subsamp == TJSAMP_444 || subsamp == TJSAMP_GRAY ||
        (subsamp == TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 2 || sf[i].denom == 1)) ||
        (subsamp != TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 4 || sf[i].denom == 2 || sf[i].denom == 1)))
      _decompTest(handle, jpegBuf, jpegSize, w, h, pf, basename, subsamp,
                  flags, sf[i]);
  }

bailout:
  return;
}